

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O3

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::CreateConstant
          (ScalarEvolutionAnalysis *this,int64_t integer)

{
  SENode *pSVar1;
  __uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_20;
  
  local_20._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
  super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
       (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
       operator_new(0x38);
  *(long *)((long)local_20._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                  .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_20._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                  .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x10) = 0;
  *(long *)((long)local_20._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                  .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x18) = 0;
  *(ScalarEvolutionAnalysis **)
   ((long)local_20._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x20) = this;
  SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
  *(int *)((long)local_20._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                 .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x28) =
       SENode::NumberOfNodes;
  *(undefined ***)
   local_20._M_t.
   super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
   super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl = &PTR_GetType_00939c00;
  *(int64_t *)
   ((long)local_20._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x30) = integer;
  pSVar1 = GetCachedOrAdd(this,(unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                                *)&local_20);
  if ((_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
      local_20._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
      super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl != (SENode *)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x10
                ))();
  }
  return pSVar1;
}

Assistant:

SENode* ScalarEvolutionAnalysis::CreateConstant(int64_t integer) {
  return GetCachedOrAdd(
      std::unique_ptr<SENode>(new SEConstantNode(this, integer)));
}